

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O1

void __thiscall chrono::ChBodyAuxRef::SetFrame_REF_to_abs(ChBodyAuxRef *this,ChFrame<double> *mfra)

{
  ChFrameMoving<double> tmp;
  ChFrameMoving<double> local_110;
  
  local_110.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[0];
  local_110.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[1];
  local_110.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[2];
  local_110.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[0];
  local_110.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[1];
  local_110.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[2];
  local_110.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[3];
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->auxref_to_cog).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  local_110.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_110.coord_dt.pos.m_data[0] = (this->auxref_to_cog).coord_dt.pos.m_data[0];
  local_110.coord_dt.pos.m_data[1] = (this->auxref_to_cog).coord_dt.pos.m_data[1];
  local_110.coord_dt.pos.m_data[2] = (this->auxref_to_cog).coord_dt.pos.m_data[2];
  local_110.coord_dt.rot.m_data[0] = (this->auxref_to_cog).coord_dt.rot.m_data[0];
  local_110.coord_dt.rot.m_data[1] = (this->auxref_to_cog).coord_dt.rot.m_data[1];
  local_110.coord_dt.rot.m_data[2] = (this->auxref_to_cog).coord_dt.rot.m_data[2];
  local_110.coord_dt.rot.m_data[3] = (this->auxref_to_cog).coord_dt.rot.m_data[3];
  local_110.coord_dtdt.pos.m_data[0] = (this->auxref_to_cog).coord_dtdt.pos.m_data[0];
  local_110.coord_dtdt.pos.m_data[1] = (this->auxref_to_cog).coord_dtdt.pos.m_data[1];
  local_110.coord_dtdt.pos.m_data[2] = (this->auxref_to_cog).coord_dtdt.pos.m_data[2];
  local_110.coord_dtdt.rot.m_data[0] = (this->auxref_to_cog).coord_dtdt.rot.m_data[0];
  local_110.coord_dtdt.rot.m_data[1] = (this->auxref_to_cog).coord_dtdt.rot.m_data[1];
  local_110.coord_dtdt.rot.m_data[2] = (this->auxref_to_cog).coord_dtdt.rot.m_data[2];
  local_110.coord_dtdt.rot.m_data[3] = (this->auxref_to_cog).coord_dtdt.rot.m_data[3];
  ChFrameMoving<double>::Invert(&local_110);
  ChFrame<double>::TransformLocalToParent
            (mfra,&local_110.super_ChFrame<double>,
             (ChFrame<double> *)&(this->super_ChBody).super_ChBodyFrame);
  ChFrameMoving<double>::operator=(&this->auxref_to_abs,mfra);
  return;
}

Assistant:

void ChBodyAuxRef::SetFrame_REF_to_abs(const ChFrame<>& mfra) {
    mfra.TransformLocalToParent(this->auxref_to_cog.GetInverse(), *this);
    // or, also, using overloaded operators for frames:
    //   *this = this->auxref_to_cog.GetInverse() >> mfra;

    auxref_to_abs = mfra;
}